

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_sunlinsol.c
# Opt level: O0

int Test_SUNLinSolSetPreconditioner
              (SUNLinearSolver S,void *Pdata,SUNPSetupFn PSetup,SUNPSolveFn PSolve,int myid)

{
  uint uVar1;
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined8 in_RSI;
  undefined8 in_RDI;
  uint in_R8D;
  double dVar2;
  double dVar3;
  double stop_time;
  double start_time;
  int failure;
  int local_4;
  
  dVar2 = get_time();
  uVar1 = SUNLinSolSetPreconditioner(in_RDI,in_RSI,in_RDX,in_RCX);
  sync_device();
  dVar3 = get_time();
  if (uVar1 == 0) {
    if ((in_R8D == 0) &&
       (printf("    PASSED test -- SUNLinSolSetPreconditioner \n"), print_time != 0)) {
      printf("    SUNLinSolSetPreconditioner Time: %22.15e \n \n",dVar3 - dVar2);
    }
    local_4 = 0;
  }
  else {
    printf(">>> FAILED test -- SUNLinSolSetPreconditioner returned %d on Proc %d \n",(ulong)uVar1,
           (ulong)in_R8D);
    local_4 = 1;
  }
  return local_4;
}

Assistant:

int Test_SUNLinSolSetPreconditioner(SUNLinearSolver S, void* Pdata,
                                    SUNPSetupFn PSetup, SUNPSolveFn PSolve,
                                    int myid)
{
  int failure;
  double start_time, stop_time;

  /* try calling SetPreconditioner routine: should pass/fail based on expected input */
  start_time = get_time();
  failure    = SUNLinSolSetPreconditioner(S, Pdata, PSetup, PSolve);
  sync_device();
  stop_time = get_time();

  if (failure)
  {
    printf(">>> FAILED test -- SUNLinSolSetPreconditioner returned %d on Proc "
           "%d \n",
           failure, myid);
    return (1);
  }
  else if (myid == 0)
  {
    printf("    PASSED test -- SUNLinSolSetPreconditioner \n");
    PRINT_TIME("    SUNLinSolSetPreconditioner Time: %22.15e \n \n",
               stop_time - start_time);
  }

  return (0);
}